

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

SC_Lib * Abc_SclReadFromGenlib(void *pLib0)

{
  int iVar1;
  SC_Lib *p;
  Mio_Library_t *pLib;
  void *pLib0_local;
  
  pLib0_local = Abc_SclLibAlloc();
  iVar1 = Abc_SclReadLibraryGenlib((SC_Lib *)pLib0_local,(Mio_Library_t *)pLib0);
  if (iVar1 == 0) {
    pLib0_local = (void *)0x0;
  }
  else {
    Abc_SclHashCells((SC_Lib *)pLib0_local);
    Abc_SclLinkCells((SC_Lib *)pLib0_local);
  }
  return (SC_Lib *)pLib0_local;
}

Assistant:

SC_Lib * Abc_SclReadFromGenlib( void * pLib0 )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pLib0;
    SC_Lib * p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibraryGenlib( p, pLib ) )
        return NULL;
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}